

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sync.cpp
# Opt level: O2

void __thiscall
SyncFixture_SyncToBadVersions_Test::TestBody(SyncFixture_SyncToBadVersions_Test *this)

{
  database *db;
  undefined1 *__m;
  uint64_t *puVar1;
  bool bVar2;
  allocator local_b0 [8];
  AssertionResult gtest_ar;
  undefined4 local_84;
  string local_80;
  transaction_type t1;
  
  pstore::get_error_category();
  local_84 = 2;
  puVar1 = &t1.super_transaction_base.size_;
  t1.super_transaction_base.size_ = 0;
  t1.super_transaction_base.dbsize_ = 0;
  t1.super_transaction_base.db_ = (database *)0x0;
  t1.super_transaction_base._vptr_transaction_base = (_func_int **)puVar1;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    pstore::database::sync(&(this->super_SyncFixture).db_);
  }
  std::__cxx11::string::assign((char *)&t1);
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_80,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/common/check_for_error.hpp"
             ,0x28,(char *)t1.super_transaction_base._vptr_transaction_base);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
  if (gtest_ar._0_8_ != 0) {
    (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
  }
  std::__cxx11::string::~string((string *)&t1);
  db = &(this->super_SyncFixture).db_;
  __m = &(this->super_SyncFixture).field_0x10;
  std::unique_lock<mock_mutex>::unique_lock((unique_lock<mock_mutex> *)&gtest_ar,(mutex_type *)__m);
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&t1,db,(unique_lock<mock_mutex> *)&gtest_ar);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&gtest_ar);
  std::__cxx11::string::string((string *)&gtest_ar,"a",local_b0);
  std::__cxx11::string::string((string *)&local_80,"first value",(allocator *)&local_84);
  anon_unknown.dwarf_2f1133::SyncFixture::add
            (&this->super_SyncFixture,&t1,(string *)&gtest_ar,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&gtest_ar);
  pstore::transaction_base::commit(&t1.super_transaction_base);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction(&t1);
  pstore::database::sync(db);
  std::unique_lock<mock_mutex>::unique_lock((unique_lock<mock_mutex> *)&gtest_ar,(mutex_type *)__m);
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&t1,db,(unique_lock<mock_mutex> *)&gtest_ar);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&gtest_ar);
  std::__cxx11::string::string((string *)&gtest_ar,"b",local_b0);
  std::__cxx11::string::string((string *)&local_80,"second value",(allocator *)&local_84);
  anon_unknown.dwarf_2f1133::SyncFixture::add
            (&this->super_SyncFixture,&t1,(string *)&gtest_ar,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&gtest_ar);
  pstore::transaction_base::commit(&t1.super_transaction_base);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction(&t1);
  pstore::get_error_category();
  local_84 = 2;
  t1.super_transaction_base.size_ = 0;
  t1.super_transaction_base.dbsize_ = 0;
  t1.super_transaction_base.db_ = (database *)0x0;
  t1.super_transaction_base._vptr_transaction_base = (_func_int **)puVar1;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    pstore::database::sync(db);
  }
  std::__cxx11::string::assign((char *)&t1);
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_80,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/common/check_for_error.hpp"
             ,0x28,(char *)t1.super_transaction_base._vptr_transaction_base);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
  if (gtest_ar._0_8_ != 0) {
    (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
  }
  std::__cxx11::string::~string((string *)&t1);
  return;
}

Assistant:

TEST_F (SyncFixture, SyncToBadVersions) {
    check_for_error ([this] () { db_.sync (1); }, pstore::error_code::unknown_revision);

    {
        transaction_type t1 = begin (db_, lock_guard{mutex_});
        this->add (t1, "a", "first value");
        t1.commit ();
    }
    db_.sync (1);
    {
        transaction_type t2 = begin (db_, lock_guard{mutex_});
        this->add (t2, "b", "second value");
        t2.commit ();
    }

    check_for_error ([this] () { db_.sync (3); }, pstore::error_code::unknown_revision);
}